

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

void __thiscall ON_wString::UrlEncode(ON_wString *this)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *__src;
  int iVar3;
  int local_40;
  int i;
  int count;
  wchar_t *s;
  wchar_t *s1;
  wchar_t *buffer;
  wchar_t local_18;
  wchar_t c1;
  wchar_t c0;
  wchar_t c;
  ON_wString *this_local;
  
  s1 = (wchar_t *)0x0;
  s = (wchar_t *)0x0;
  _i = Array(this);
  iVar2 = Length(this);
  for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
    wVar1 = *_i;
    if (wVar1 == L'\0') break;
    if ((wVar1 < L'0') || (L'9' < wVar1)) {
      if ((wVar1 < L'a') || (L'z' < wVar1)) {
        if ((wVar1 < L'A') || (L'Z' < wVar1)) {
          if (wVar1 < L'Ā') {
            if (s == (wchar_t *)0x0) {
              s1 = (wchar_t *)onmalloc((long)(iVar2 * 3 + 1) << 2);
              if (0 < local_40) {
                __src = Array(this);
                memcpy(s1,__src,(long)local_40 << 2);
              }
              s = s1 + local_40;
            }
            iVar3 = (int)((long)((ulong)(uint)((int)((long)wVar1 / 0x10) >> 0x1f) << 0x20 |
                                (long)wVar1 / 0x10 & 0xffffffffU) % 0x10);
            local_18 = iVar3 + L'0';
            if (L'9' < local_18) {
              local_18 = iVar3 + L'7';
            }
            buffer._4_4_ = wVar1 % 0x10 + L'0';
            if (L'9' < buffer._4_4_) {
              buffer._4_4_ = wVar1 % 0x10 + L'7';
            }
            *s = L'%';
            s[1] = local_18;
            s[2] = buffer._4_4_;
            s = s + 3;
          }
          else if (s != (wchar_t *)0x0) {
            *s = wVar1;
            s = s + 1;
          }
        }
        else if (s != (wchar_t *)0x0) {
          *s = wVar1;
          s = s + 1;
        }
      }
      else if (s != (wchar_t *)0x0) {
        *s = wVar1;
        s = s + 1;
      }
    }
    else if (s != (wchar_t *)0x0) {
      *s = wVar1;
      s = s + 1;
    }
    _i = _i + 1;
  }
  if (s != (wchar_t *)0x0) {
    *s = L'\0';
    operator=(this,s1);
    onfree(s1);
  }
  return;
}

Assistant:

void ON_wString::UrlEncode()
{
  wchar_t c, c0, c1;
  wchar_t* buffer = 0;
  wchar_t* s1 = 0;
  const wchar_t* s = Array();
  const int count = Length();
  int i;

  for ( i = 0; i < count; i++ )
  {
    c = *s++;
    if ( 0 == c )
      break;
    if ('0' <= c && c <= '9')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('a' <= c && c <= 'z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('A' <= c && c <= 'Z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if (c >= 256)
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }

    // convert this character to %xx
    if ( !s1 )
    {
      buffer = (wchar_t*)onmalloc((count*3 + 1)*sizeof(buffer[0]));
      if ( i > 0 )
        memcpy(buffer,Array(),i*sizeof(buffer[0]));
      s1 = buffer+i;
    }
    c0 = ((c/16)%16) + '0';
    if ( c0 > '9' )
      c0 += ('A'-'9'-1);
    c1 = (c%16) + '0';
    if ( c1 > '9' )
      c1 += ('A'-'9'-1);
    *s1++ = '%';
    *s1++ = c0;
    *s1++ = c1;
  }
  if ( s1 )
  {
    *s1 = 0;
    *this = buffer;
    onfree(buffer);
  }
}